

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O2

RC __thiscall RM_FileHandle::UpdateRec(RM_FileHandle *this,RM_Record *rec)

{
  PF_FileHandle *this_00;
  RC RVar1;
  RC RVar2;
  RC RVar3;
  size_t __n;
  RM_FileHandle *this_01;
  PageNum page;
  SlotNum slot;
  RID rid;
  PF_PageHandle ph;
  char *recData;
  char *bitmap;
  RM_PageHeader *pageheader;
  
  if (this->openedFH == true) {
    RID::RID(&rid);
    this_01 = (RM_FileHandle *)rec;
    RVar1 = RM_Record::GetRid(rec,&rid);
    if ((RVar1 == 0) && (RVar1 = GetPageNumAndSlot(this_01,&rid,&page,&slot), RVar1 == 0)) {
      PF_PageHandle::PF_PageHandle(&ph);
      this_00 = &this->pfh;
      RVar1 = PF_FileHandle::GetThisPage(this_00,page,&ph);
      if (RVar1 == 0) {
        RVar2 = GetPageDataAndBitmap(this,&ph,&bitmap,&pageheader);
        if (RVar2 == 0) {
          if ((this->header).numRecordsPerPage < slot) {
            RVar2 = 0x68;
          }
          else if (((uint)(int)bitmap[slot / 8] >> (slot % 8 & 0x1fU) & 1) == 0) {
            RVar2 = 0x67;
          }
          else {
            RVar2 = RM_Record::GetData(rec,&recData);
            if (RVar2 == 0) {
              __n = (size_t)(this->header).recordSize;
              memcpy(bitmap + (long)slot * __n + (long)(this->header).bitmapSize,recData,__n);
              RVar2 = 0;
            }
          }
        }
        RVar1 = PF_FileHandle::MarkDirty(this_00,page);
        if ((RVar1 == 0) &&
           (RVar3 = PF_FileHandle::UnpinPage(this_00,page), RVar1 = RVar2, RVar3 != 0)) {
          RVar1 = RVar3;
        }
      }
      PF_PageHandle::~PF_PageHandle(&ph);
    }
    RID::~RID(&rid);
  }
  else {
    RVar1 = 0x6a;
  }
  return RVar1;
}

Assistant:

RC RM_FileHandle::UpdateRec (const RM_Record &rec) {
  // only proceed if this filehandle is associated with an open file
  if (!isValidFH())
    return (RM_INVALIDFILE);
  RC rc = 0;

  // retrieves the page and slot number of the record
  RID rid;
  if((rc = rec.GetRid(rid)))
    return (rc);
  PageNum page;
  SlotNum slot;
  if((rc = GetPageNumAndSlot(rid, page, slot)))
    return (rc);

  // gets the page, bitmap and pageheader for this page that holds the record
  PF_PageHandle ph;
  if((rc = pfh.GetThisPage(page, ph)))
    return (rc);
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = GetPageDataAndBitmap(ph, bitmap, pageheader)))
    goto cleanup_and_exit;

  // Check if there really exists a record here according to the header
  bool recordExists;
  if ((rc = CheckBitSet(bitmap, header.numRecordsPerPage, slot, recordExists)))
    goto cleanup_and_exit;
  if(!recordExists){
    rc = RM_INVALIDRECORD;
    goto cleanup_and_exit;
  }
  
  // updates its contents
  char * recData;
  if((rc = rec.GetData(recData)))
    goto cleanup_and_exit;
  memcpy(bitmap + (header.bitmapSize) + slot*(header.recordSize),
    recData, header.recordSize);

  // always unpin the page before returning
  cleanup_and_exit:
  RC rc2;
  if((rc2 = pfh.MarkDirty(page)) || (rc2 = pfh.UnpinPage(page)))
    return (rc2);
  return (rc); 
}